

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsSerializeParserState
          (JsValueRef scriptVal,JsValueRef *bufferVal,JsParseScriptAttributes parseAttributes)

{
  JsErrorCode JVar1;
  uchar *buffer;
  byte *local_28;
  byte *script;
  size_t cb;
  LoadScriptFlag scriptFlag;
  uint bufferSize;
  
  JVar1 = JsErrorNullArgument;
  if (bufferVal != (JsValueRef *)0x0 && scriptVal != (JsValueRef)0x0) {
    *bufferVal = (JsValueRef)0x0;
    local_28 = (byte *)0x0;
    script = (byte *)0x0;
    cb._0_4_ = LoadScriptFlag_None;
    JVar1 = GetScriptBufferDetails
                      (scriptVal,parseAttributes,(LoadScriptFlag *)&cb,(size_t *)&script,&local_28);
    if (JVar1 == JsNoError) {
      cb._4_4_ = 0;
      JVar1 = JsSerializeParserStateCore
                        (local_28,(size_t)script,(LoadScriptFlag)cb,(uchar *)0x0,
                         (uint *)((long)&cb + 4));
      if (JVar1 == JsNoError) {
        if (cb._4_4_ == 0) {
          JVar1 = JsErrorScriptCompile;
        }
        else {
          JVar1 = JsCreateArrayBuffer(cb._4_4_,bufferVal);
          if (JVar1 == JsNoError) {
            buffer = (uchar *)(**(code **)(**bufferVal + 0x390))();
            JVar1 = JsSerializeParserStateCore
                              (local_28,(size_t)script,(LoadScriptFlag)cb,buffer,
                               (uint *)((long)&cb + 4));
          }
        }
      }
    }
  }
  return JVar1;
}

Assistant:

CHAKRA_API JsSerializeParserState(
    _In_ JsValueRef scriptVal,
    _Out_ JsValueRef *bufferVal,
    _In_ JsParseScriptAttributes parseAttributes)
{
    PARAM_NOT_NULL(scriptVal);
    PARAM_NOT_NULL(bufferVal);
    VALIDATE_JSREF(scriptVal);

    *bufferVal = nullptr;

    const byte* script = nullptr;
    size_t cb = 0;
    LoadScriptFlag scriptFlag = LoadScriptFlag_None;

    JsErrorCode errorCode = GetScriptBufferDetails(scriptVal, parseAttributes,
        &scriptFlag, &cb, &script);

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    unsigned int bufferSize = 0;
    errorCode = JsSerializeParserStateCore(script, cb, scriptFlag, nullptr,
        &bufferSize);

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    if (bufferSize == 0)
    {
        return JsErrorScriptCompile;
    }

    if ((errorCode = JsCreateArrayBuffer(bufferSize, bufferVal)) == JsNoError)
    {
        byte* buffer = ((Js::ArrayBuffer*)(*bufferVal))->GetBuffer();
        errorCode = JsSerializeParserStateCore(script, cb, scriptFlag, buffer,
            &bufferSize);
    }

    return errorCode;
}